

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UCalendarDateFields __thiscall
icu_63::Calendar::resolveFields(Calendar *this,UFieldResolutionTable *precedenceTable)

{
  int iVar1;
  uint uVar2;
  uint local_34;
  int32_t s;
  int32_t i;
  int32_t lineStamp;
  int32_t l;
  int32_t bestStamp;
  int32_t g;
  int32_t tempBestField;
  int32_t bestField;
  UFieldResolutionTable *precedenceTable_local;
  Calendar *this_local;
  
  g = 0x17;
  l = 0;
  do {
    if (precedenceTable[l][0][0] == -1 || g != 0x17) {
      return g;
    }
    lineStamp = 0;
    i = 0;
    while (precedenceTable[l][i][0] != -1) {
      s = 0;
      for (local_34 = (uint)(0x1f < precedenceTable[l][i][0]);
          precedenceTable[l][i][(int)local_34] != -1; local_34 = local_34 + 1) {
        iVar1 = this->fStamp[precedenceTable[l][i][(int)local_34]];
        if (iVar1 == 0) goto LAB_00217d29;
        if (s < iVar1) {
          s = iVar1;
        }
      }
      if (lineStamp < s) {
        bestStamp = precedenceTable[l][i][0];
        uVar2 = bestStamp;
        if ((0x1f < bestStamp) &&
           ((bestStamp = bestStamp & 0x1f, bestStamp != 5 ||
            (uVar2 = g, this->fStamp[4] < this->fStamp[5])))) {
          uVar2 = bestStamp;
        }
        g = uVar2;
        if (g == bestStamp) {
          lineStamp = s;
        }
      }
LAB_00217d29:
      i = i + 1;
    }
    l = l + 1;
  } while( true );
}

Assistant:

UCalendarDateFields Calendar::resolveFields(const UFieldResolutionTable* precedenceTable) {
    int32_t bestField = UCAL_FIELD_COUNT;
    int32_t tempBestField;
    for (int32_t g=0; precedenceTable[g][0][0] != -1 && (bestField == UCAL_FIELD_COUNT); ++g) {
        int32_t bestStamp = kUnset;
        for (int32_t l=0; precedenceTable[g][l][0] != -1; ++l) {
            int32_t lineStamp = kUnset;
            // Skip over first entry if it is negative
            for (int32_t i=((precedenceTable[g][l][0]>=kResolveRemap)?1:0); precedenceTable[g][l][i]!=-1; ++i) {
                U_ASSERT(precedenceTable[g][l][i] < UCAL_FIELD_COUNT);
                int32_t s = fStamp[precedenceTable[g][l][i]];
                // If any field is unset then don't use this line
                if (s == kUnset) {
                    goto linesInGroup;
                } else if(s > lineStamp) {
                    lineStamp = s;
                }
            }
            // Record new maximum stamp & field no.
            if (lineStamp > bestStamp) {
                tempBestField = precedenceTable[g][l][0]; // First field refers to entire line
                if (tempBestField >= kResolveRemap) {
                    tempBestField &= (kResolveRemap-1);
                    // This check is needed to resolve some issues with UCAL_YEAR precedence mapping
                    if (tempBestField != UCAL_DATE || (fStamp[UCAL_WEEK_OF_MONTH] < fStamp[tempBestField])) {
                        bestField = tempBestField;
                    }
                } else {
                    bestField = tempBestField;
                }

                if (bestField == tempBestField) {
                    bestStamp = lineStamp;
                }
            }
linesInGroup:
            ;
        }
    }
    return (UCalendarDateFields)bestField;
}